

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ParameterValueAssignmentSyntax * __thiscall
slang::parsing::Parser::parseParameterValueAssignment(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token openParen_00;
  Token hash_00;
  Token closeParen_00;
  bool bVar1;
  undefined8 in_RDI;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> list;
  Token closeParen;
  Token openParen;
  Token hash;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *in_stack_00000120;
  Token *in_stack_00000128;
  TokenKind in_stack_00000132;
  TokenKind in_stack_00000134;
  TokenKind in_stack_00000136;
  ParserBase *in_stack_00000138;
  Token *in_stack_00000150;
  RequireItems in_stack_00000158;
  DiagCode in_stack_00000160;
  anon_class_8_1_8991fb9c *in_stack_00000168;
  AllowEmpty in_stack_00000170;
  Token *in_stack_fffffffffffffef0;
  uint uVar2;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *this_00;
  undefined4 uVar3;
  undefined2 in_stack_fffffffffffffefc;
  TokenKind in_stack_fffffffffffffefe;
  ParserBase *in_stack_ffffffffffffff00;
  __extent_storage<18446744073709551615UL> _Var4;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff0c;
  ParserBase *in_stack_ffffffffffffff10;
  undefined1 local_60 [12];
  undefined4 local_54;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *local_40;
  SyntaxFactory *local_38;
  Token local_20;
  ParameterValueAssignmentSyntax *local_8;
  
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff00,in_stack_fffffffffffffefe);
  if (bVar1) {
    local_20 = ParserBase::consume(in_stack_ffffffffffffff10);
    Token::Token(in_stack_fffffffffffffef0);
    Token::Token(in_stack_fffffffffffffef0);
    uVar2 = (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    std::span<slang::syntax::TokenOrSyntax,_18446744073709551615UL>::span
              ((span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *)0x2e99ec);
    local_54 = 0x2d0005;
    _Var4._M_extent_value = (size_t)local_60;
    this_00 = (SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)((ulong)uVar2 << 0x20);
    uVar3 = 0x2d0005;
    uVar5 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleParamAssignment,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseParameterValueAssignment()::__0>
              (in_stack_00000138,in_stack_00000136,in_stack_00000134,in_stack_00000132,
               in_stack_00000128,in_stack_00000120,in_stack_00000150,in_stack_00000158,
               in_stack_00000160,in_stack_00000168,in_stack_00000170);
    elements._M_ptr._4_2_ = in_stack_fffffffffffffefc;
    elements._M_ptr._0_4_ = uVar3;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffefe;
    elements._M_extent._M_extent_value = _Var4._M_extent_value;
    slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::SeparatedSyntaxList
              (this_00,elements);
    hash_00.rawLen = in_stack_ffffffffffffff0c;
    hash_00.kind = (short)uVar5;
    hash_00._2_1_ = (char)((uint)uVar5 >> 0x10);
    hash_00.numFlags.raw = (char)((uint)uVar5 >> 0x18);
    hash_00.info = (Info *)in_stack_ffffffffffffff10;
    openParen_00.rawLen._0_2_ = in_stack_fffffffffffffefc;
    openParen_00.kind = (short)uVar3;
    openParen_00._2_1_ = (char)((uint)uVar3 >> 0x10);
    openParen_00.numFlags.raw = (char)((uint)uVar3 >> 0x18);
    openParen_00.rawLen._2_2_ = in_stack_fffffffffffffefe;
    openParen_00.info = (Info *)_Var4._M_extent_value;
    closeParen_00.info = (Info *)local_40;
    closeParen_00.kind = (short)in_RDI;
    closeParen_00._2_1_ = (char)((ulong)in_RDI >> 0x10);
    closeParen_00.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
    closeParen_00.rawLen = (int)((ulong)in_RDI >> 0x20);
    local_8 = slang::syntax::SyntaxFactory::parameterValueAssignment
                        (local_38,hash_00,openParen_00,local_40,closeParen_00);
  }
  else {
    local_8 = (ParameterValueAssignmentSyntax *)0x0;
  }
  return local_8;
}

Assistant:

ParameterValueAssignmentSyntax* Parser::parseParameterValueAssignment() {
    if (!peek(TokenKind::Hash))
        return nullptr;

    auto hash = consume();

    Token openParen;
    Token closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleParamAssignment, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::False, diag::ExpectedArgument,
        [this] { return &parseParamValue(); });

    return &factory.parameterValueAssignment(hash, openParen, list, closeParen);
}